

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ActivationReLU::_InternalParse
          (ActivationReLU *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar4;
  uint res;
  InternalMetadata *this_00;
  pair<const_char_*,_unsigned_int> pVar5;
  byte *local_28;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  local_28 = (byte *)ptr;
  while( true ) {
    bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_28,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_28;
    }
    bVar1 = *local_28;
    res = (uint)bVar1;
    pbVar4 = local_28 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar4 * 0x80) - 0x80;
      if ((char)*pbVar4 < '\0') {
        pVar5 = google::protobuf::internal::ReadTagFallback((char *)local_28,res);
        pbVar4 = (byte *)pVar5.first;
        res = pVar5.second;
      }
      else {
        pbVar4 = local_28 + 2;
      }
    }
    if ((res == 0) || ((res & 7) == 4)) break;
    uVar2 = this_00->ptr_;
    local_28 = pbVar4;
    if ((uVar2 & 1) == 0) {
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((uVar2 & 0xfffffffffffffffc) + 8);
    }
    local_28 = (byte *)google::protobuf::internal::UnknownFieldParse
                                 (res,unknown,(char *)local_28,ctx);
    if (local_28 == (byte *)0x0) {
      return (char *)0x0;
    }
  }
  if (pbVar4 == (byte *)0x0) {
    return (char *)0x0;
  }
  (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
  return (char *)pbVar4;
}

Assistant:

const char* ActivationReLU::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}